

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_zip.c
# Opt level: O0

void test_compat_zip_2(void)

{
  archive_entry *paVar1;
  void *unaff_retaddr;
  archive *a;
  archive_entry *ae;
  char name [22];
  char *in_stack_000003e0;
  archive *in_stack_ffffffffffffffc8;
  archive_entry *paVar2;
  archive_entry **ppaVar3;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  uint in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe4;
  char *file;
  wchar_t line;
  undefined4 uVar5;
  undefined2 uVar6;
  undefined2 in_stack_fffffffffffffffe;
  
  file = (char *)0x6d6f635f74736574;
  line = L'\x5f70697a';
  uVar5 = 0x697a2e32;
  uVar6 = 0x70;
  paVar1 = (archive_entry *)archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (wchar_t)((ulong)paVar1 >> 0x20),(wchar_t)paVar1,
                   (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8);
  archive_read_support_filter_all(in_stack_ffffffffffffffc8);
  paVar2 = paVar1;
  assertion_equal_int(file,in_stack_ffffffffffffffe4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (longlong)paVar1,(char *)0x146e3e,unaff_retaddr);
  archive_read_support_format_zip((archive *)paVar1);
  assertion_equal_int(file,in_stack_ffffffffffffffe4,(longlong)paVar2,
                      (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (longlong)paVar2,(char *)0x146e77,unaff_retaddr);
  extract_reference_file(in_stack_000003e0);
  archive_read_open_filename
            ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(char *)paVar2
             ,CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  paVar1 = paVar2;
  assertion_equal_int(file,in_stack_ffffffffffffffe4,(longlong)paVar2,
                      (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (longlong)paVar2,(char *)0x146ec4,unaff_retaddr);
  archive_read_next_header
            ((archive *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (archive_entry **)paVar2);
  paVar2 = paVar1;
  assertion_equal_int(file,in_stack_ffffffffffffffe4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      (longlong)paVar1,(char *)0x146f02,unaff_retaddr);
  archive_entry_pathname(paVar1);
  ppaVar3 = (archive_entry **)0x0;
  uVar4 = 0;
  assertion_equal_string
            ((char *)CONCAT26(in_stack_fffffffffffffffe,CONCAT24(uVar6,uVar5)),line,file,
             (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(char *)paVar2,
             (char *)((ulong)in_stack_ffffffffffffffd4 << 0x20),a,(wchar_t)ae);
  archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),ppaVar3);
  paVar1 = paVar2;
  assertion_equal_int(file,in_stack_ffffffffffffffe4,(longlong)paVar2,
                      (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),(longlong)paVar2,
                      (char *)0x146f87,unaff_retaddr);
  archive_entry_pathname(paVar2);
  ppaVar3 = (archive_entry **)0x0;
  uVar4 = 0;
  assertion_equal_string
            ((char *)CONCAT26(in_stack_fffffffffffffffe,CONCAT24(uVar6,uVar5)),line,file,
             (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),(char *)paVar1,
             (char *)((ulong)in_stack_ffffffffffffffd4 << 0x20),a,(wchar_t)ae);
  archive_read_next_header((archive *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),ppaVar3);
  assertion_equal_int(file,in_stack_ffffffffffffffe4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),(longlong)paVar1,
                      (char *)0x14700d,unaff_retaddr);
  archive_read_close((archive *)0x147017);
  assertion_equal_int(file,in_stack_ffffffffffffffe4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),0,(char *)0x147045,
                      unaff_retaddr);
  archive_read_free((archive *)0x14704f);
  assertion_equal_int(file,in_stack_ffffffffffffffe4,(longlong)paVar1,
                      (char *)CONCAT44(in_stack_ffffffffffffffd4,uVar4),0,(char *)0x14707d,
                      unaff_retaddr);
  return;
}

Assistant:

DEFINE_TEST(test_compat_zip_2)
{
	char name[] = "test_compat_zip_2.zip";
	struct archive_entry *ae;
	struct archive *a;

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip(a));
	extract_reference_file(name);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_filename(a, name, 10240));

	/* Read first entry. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("file1", archive_entry_pathname(ae));

	/* Read first entry. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("file2", archive_entry_pathname(ae));

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}